

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::applyBC
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode param_5,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  FabSet *pFVar7;
  double dVar8;
  int j;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  FabArray<amrex::FArrayBox> *this_00;
  int iVar19;
  long lVar20;
  int *piVar21;
  ulong uVar22;
  int k;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Periodicity PVar30;
  IntVect IVar31;
  Array4<double> local_408;
  ulong local_3c8;
  long local_3c0;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  BCMode local_3ac;
  long local_3a8;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  long local_390;
  IntVect hi;
  undefined4 uStack_37c;
  long local_378;
  int local_368;
  int local_364;
  int local_360;
  IntVect low;
  undefined4 uStack_33c;
  long local_338;
  int local_328;
  int local_324;
  int local_320;
  double local_2f8 [8];
  ulong local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  int local_254;
  int local_250;
  int local_24c;
  FabArray<amrex::FArrayBox> *local_248;
  ulong local_240;
  Array4<const_double> local_238;
  ulong local_1f8;
  long local_1f0;
  int local_1e8;
  uint local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  Array4<const_double> local_1d0;
  long local_190;
  double local_188;
  double local_180;
  ulong local_178;
  Box local_170;
  MFItInfo local_154;
  long local_140;
  ulong local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  double *local_110;
  FabSet *local_108;
  long local_100;
  double local_f8;
  ulong local_f0;
  long *local_e8;
  long *local_e0;
  MFIter mfi;
  FArrayBox foofab;
  
  local_3ac = bc_mode;
  uVar9 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar10 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x45])(this);
  iVar11 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x46])(this);
  local_3c8 = CONCAT71(local_3c8._1_7_,(char)iVar11);
  lVar18 = (long)mglev;
  local_248 = &in->super_FabArray<amrex::FArrayBox>;
  if (!skip_fillboundary) {
    PVar30 = Geometry::periodicity
                       ((Geometry *)
                        (lVar18 * 200 +
                        *(long *)&(this->super_MLLinOp).m_geom.
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar30.period.vect._0_8_;
    mfi.fabArray._0_4_ = PVar30.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (&in->super_FabArray<amrex::FArrayBox>,0,uVar9,(Periodicity *)&mfi,SUB41(iVar10,0));
  }
  lVar12 = *(long *)&(this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar20 = lVar18 * 200;
  local_180 = *(double *)(lVar12 + 0x38 + lVar20);
  local_f8 = *(double *)(lVar12 + 0x40 + lVar20);
  local_188 = *(double *)(lVar12 + 0x48 + lVar20);
  local_100 = lVar18 * 0x900 +
              *(long *)&(this->m_maskvals).
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  local_1e4 = (this->super_MLLinOp).maxorder;
  local_140 = *(long *)(*(long *)&(this->m_bcondloc).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar18 * 8);
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  mfi.fabArray._0_4_ = 0;
  mfi.fabArray._4_4_ = 0;
  FArrayBox::FArrayBox(&foofab,(Box *)&mfi,uVar9,true,false,(Arena *)0x0);
  local_110 = foofab.super_BaseFab<double>.dptr;
  local_1e8 = foofab.super_BaseFab<double>.nvar;
  local_190 = (long)foofab.super_BaseFab<double>.domain.smallend.vect[2];
  local_1f8 = (ulong)foofab.super_BaseFab<double>.domain.smallend.vect[1];
  local_154.do_tiling = false;
  local_154.dynamic = true;
  local_154.device_sync = true;
  local_154.num_streams = Gpu::Device::max_gpu_streams;
  local_154.tilesize.vect[0] = 0;
  local_154.tilesize.vect[1] = 0;
  local_154.tilesize.vect[2] = 0;
  if ((byte)(SUB41(iVar10,0) | (byte)local_3c8) == 1) {
    local_f0 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
    MFIter::MFIter(&mfi,&local_248->super_FabArrayBase,&local_154);
    local_120 = (long)foofab.super_BaseFab<double>.domain.bigend.vect[2] + 1;
    local_128 = ((long)foofab.super_BaseFab<double>.domain.bigend.vect[0] -
                (long)foofab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
    local_118 = (((long)foofab.super_BaseFab<double>.domain.bigend.vect[1] + 1) - local_1f8) *
                local_128;
    local_130 = (local_120 - local_190) * local_118;
    local_1f8 = local_1f8 << 0x20 |
                (ulong)(uint)foofab.super_BaseFab<double>.domain.smallend.vect[0];
    local_138 = (long)foofab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
                (long)foofab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
    local_108 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
    uVar26 = (ulong)uVar9;
    this_00 = local_248;
    if ((int)uVar9 < 1) {
      uVar26 = 0;
    }
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::validbox(&local_170,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_408,this_00,&mfi);
      piVar21 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar21 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      local_e8 = (long *)(*(long *)(local_140 + 0x200) + (long)*piVar21 * 0x18);
      local_e0 = (long *)((long)*piVar21 * 0x18 + *(long *)(local_140 + 0xf0));
      for (uVar14 = 0; uVar14 != 3; uVar14 = uVar14 + 1) {
        if (uVar14 != local_f0) {
          low.vect[2] = local_170.smallend.vect[2];
          low.vect[0] = local_170.smallend.vect[0];
          low.vect[1] = local_170.smallend.vect[1];
          hi.vect[2] = local_170.bigend.vect[2];
          hi.vect[0] = local_170.bigend.vect[0];
          hi.vect[1] = local_170.bigend.vect[1];
          iVar10 = low.vect[uVar14] + -1;
          low.vect[uVar14] = iVar10;
          hi.vect[uVar14] = iVar10;
          local_280 = (long)low.vect[0];
          local_398 = low.vect[1];
          local_3b0 = low.vect[2];
          local_278 = (long)hi.vect[0];
          iVar3 = hi.vect[1];
          lVar12 = (long)hi.vect[1];
          local_3b4 = hi.vect[2];
          low.vect[2] = local_170.smallend.vect[2];
          low.vect[0] = local_170.smallend.vect[0];
          low.vect[1] = local_170.smallend.vect[1];
          hi.vect[2] = local_170.bigend.vect[2];
          hi.vect[0] = local_170.bigend.vect[0];
          hi.vect[1] = local_170.bigend.vect[1];
          IVar31 = Box::type(&local_170);
          local_238.p = IVar31.vect._0_8_;
          local_238.jstride._0_4_ = IVar31.vect[2];
          iVar10 = (~*(uint *)((long)&local_238.p + uVar14 * 4) & 1) + hi.vect[uVar14];
          low.vect[uVar14] = iVar10;
          hi.vect[uVar14] = iVar10;
          lVar18 = local_100;
          local_3a8 = (long)low.vect[0];
          local_394 = low.vect[1];
          local_39c = low.vect[2];
          local_270 = (long)hi.vect[0];
          local_390 = (long)hi.vect[1];
          local_3b8 = hi.vect[2];
          iVar10 = local_170.bigend.vect[uVar14];
          iVar11 = local_170.smallend.vect[uVar14];
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    ((Array4<const_int> *)&low,(FabArray<amrex::Mask> *)(local_100 + uVar14 * 0x180)
                     ,&mfi);
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    ((Array4<const_int> *)&hi,
                     (FabArray<amrex::Mask> *)(lVar18 + uVar14 * 0x180 + 0x480),&mfi);
          pFVar7 = local_108;
          local_178 = uVar14;
          if (bndry == (MLMGBndry *)0x0) {
            local_238.p = local_110;
            local_238.jstride._0_4_ = (int)local_128;
            local_238.jstride._4_4_ = (undefined4)((ulong)local_128 >> 0x20);
            local_238.kstride = local_118;
            local_238.nstride = local_130;
            local_238.begin.x = (undefined4)local_1f8;
            local_238.begin.y = local_1f8._4_4_;
            local_238.begin.z = (int)local_190;
            local_238.end.x = (undefined4)local_138;
            local_238.end.y = local_138._4_4_;
            local_238.end.z = (int)local_120;
            local_238.ncomp = local_1e8;
            local_1d0.p = local_110;
            local_1d0.jstride = local_128;
            local_1d0.kstride = local_118;
            local_1d0.nstride = local_130;
            local_1d0.begin.x = (undefined4)local_1f8;
            local_1d0.begin.y = local_1f8._4_4_;
            local_1d0.begin.z = (int)local_190;
            local_1d0.end.x = (undefined4)local_138;
            local_1d0.end.y = local_138._4_4_;
            local_1d0.end.z = (int)local_120;
            local_1d0.ncomp = local_1e8;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_238,(FabArray<amrex::FArrayBox> *)(local_108 + uVar14),&mfi);
            this_00 = local_248;
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_1d0,(FabArray<amrex::FArrayBox> *)(pFVar7 + uVar14 + 3),&mfi);
          }
          dVar8 = local_f8;
          dVar6 = local_180;
          dVar5 = local_188;
          dVar1 = 1.0;
          dVar2 = 1.0;
          uVar9 = (iVar10 - iVar11) + 2;
          if ((int)local_1e4 < (int)uVar9) {
            uVar9 = local_1e4;
          }
          local_2a8 = (long)local_398;
          local_24c = local_398 + 1;
          local_250 = (int)local_280 + 1;
          local_260 = (long)local_3b0;
          local_254 = local_3b0 + 1;
          local_2b8 = 0;
          if (0 < (int)uVar9) {
            local_2b8 = (ulong)uVar9;
          }
          lVar18 = (long)(int)uVar9;
          local_288 = local_280 * 4;
          local_290 = local_280 * 8;
          local_2b0 = (long)local_394;
          local_1d4 = local_394 + -1;
          local_298 = local_3a8 * 4;
          local_2a0 = local_3a8 * 8;
          iVar10 = (int)local_3a8;
          local_1d8 = iVar10 + -1;
          local_268 = (long)local_39c;
          local_1dc = local_39c + -1;
          local_3c0 = 0;
          local_240 = (ulong)uVar9;
          uVar14 = 0;
          while (uVar22 = uVar14, uVar15 = local_240, lVar20 = local_280, uVar4 = local_2b8,
                uVar14 = local_178, uVar22 != uVar26) {
            lVar13 = uVar22 * 0x18 + *local_e0;
            iVar11 = *(int *)(lVar13 + local_178 * 4);
            lVar17 = uVar22 * 0x30 + *local_e8;
            iVar19 = *(int *)(lVar13 + 0xc + local_178 * 4);
            dVar27 = *(double *)(lVar17 + local_178 * 8);
            dVar28 = *(double *)(lVar17 + 0x18 + local_178 * 8);
            if ((int)local_178 == 1) {
              if (iVar11 == 0x65) {
                local_2f8[4] = -dVar27 * dVar8;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar14 = 0; iVar11 = local_3b0, uVar14 != uVar4; uVar14 = uVar14 + 1) {
                  dVar27 = dVar1;
                  dVar29 = dVar2;
                  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar14 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar29 = dVar29 * (local_2f8[uVar14 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar14] = dVar27 / dVar29;
                }
                for (; local_3a0 = iVar19, iVar11 <= local_3b4; iVar11 = iVar11 + 1) {
                  lVar13 = (long)iVar11;
                  lVar17 = (local_2a8 - local_408.begin.y) * local_408.jstride;
                  lVar24 = (lVar13 - local_408.begin.z) * local_408.kstride;
                  for (lVar20 = local_280; lVar20 <= local_278; lVar20 = lVar20 + 1) {
                    if (0 < *(int *)((local_2a8 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4
                                     + low.vect._0_8_ + (lVar13 - local_320) * local_338 * 4 +
                                    (lVar20 - local_328) * 4)) {
                      dVar27 = 0.0;
                      for (lVar23 = 1; lVar23 < lVar18; lVar23 = lVar23 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar20 - local_408.begin.x) +
                                           (lVar13 - local_408.begin.z) * local_408.kstride +
                                           local_408.nstride * uVar22 +
                                           ((local_398 - local_408.begin.y) + (int)lVar23) *
                                           local_408.jstride] * local_2f8[lVar23];
                      }
                      local_408.p
                      [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)]
                           = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)
                        ] = local_238.p
                            [(local_2a8 - local_238.begin.y) *
                             CONCAT44(local_238.jstride._4_4_,(int)local_238.jstride) +
                             (lVar13 - local_238.begin.z) * local_238.kstride +
                             local_238.nstride * uVar22 + (lVar20 - local_238.begin.x)] *
                            local_2f8[0] + dVar27;
                      }
                    }
                  }
                }
              }
              else {
                lVar20 = local_260;
                if (iVar11 == 0x66) {
                  for (; (int)lVar20 <= local_3b4; lVar20 = lVar20 + 1) {
                    lVar13 = (lVar20 - local_408.begin.z) * local_408.kstride;
                    for (lVar17 = 0; local_280 + lVar17 <= local_278; lVar17 = lVar17 + 1) {
                      if (0 < *(int *)((long)(local_398 - local_324) *
                                       CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                       (lVar20 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                       low.vect._0_8_ + local_288 + lVar17 * 4)) {
                        *(undefined8 *)
                         ((long)local_408.p +
                         lVar17 * 8 +
                         local_408.jstride * 8 * (long)(local_398 - local_408.begin.y) + lVar13 * 8
                         + local_408.nstride * local_3c0 + (long)local_408.begin.x * -8 + local_290)
                             = *(undefined8 *)
                                ((long)local_408.p +
                                lVar17 * 8 +
                                (long)(local_24c - local_408.begin.y) * local_408.jstride * 8 +
                                lVar13 * 8 + local_408.nstride * local_3c0 +
                                (long)local_408.begin.x * -8 + local_290);
                      }
                    }
                  }
                }
                else if (iVar11 == 0x67) {
                  for (; (int)lVar20 <= local_3b4; lVar20 = lVar20 + 1) {
                    lVar13 = (lVar20 - local_408.begin.z) * local_408.kstride;
                    for (lVar17 = 0; local_280 + lVar17 <= local_278; lVar17 = lVar17 + 1) {
                      if (0 < *(int *)((long)(local_398 - local_324) *
                                       CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                       (lVar20 - local_320) * local_338 * 4 + (long)local_328 * -4 +
                                       low.vect._0_8_ + local_288 + lVar17 * 4)) {
                        *(ulong *)((long)local_408.p +
                                  lVar17 * 8 +
                                  local_408.jstride * 8 * (long)(local_398 - local_408.begin.y) +
                                  lVar13 * 8 + local_408.nstride * local_3c0 +
                                  (long)local_408.begin.x * -8 + local_290) =
                             *(ulong *)((long)local_408.p +
                                       lVar17 * 8 +
                                       (long)(local_24c - local_408.begin.y) * local_408.jstride * 8
                                       + lVar13 * 8 + local_408.nstride * local_3c0 +
                                       (long)local_408.begin.x * -8 + local_290) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
              uVar4 = local_240;
              uVar14 = local_2b8;
              if (iVar19 == 0x65) {
                local_2f8[4] = -dVar28 * dVar8;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar15 = 0; iVar11 = local_39c, uVar15 != uVar14; uVar15 = uVar15 + 1) {
                  dVar27 = dVar1;
                  dVar28 = dVar2;
                  for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar15 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar28 = dVar28 * (local_2f8[uVar15 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar15] = dVar27 / dVar28;
                }
                for (; iVar11 <= local_3b8; iVar11 = iVar11 + 1) {
                  lVar13 = (long)iVar11;
                  lVar17 = (local_2b0 - local_408.begin.y) * local_408.jstride;
                  lVar24 = (lVar13 - local_408.begin.z) * local_408.kstride;
                  for (lVar20 = local_3a8; lVar20 <= local_270; lVar20 = lVar20 + 1) {
                    if (0 < *(int *)((local_2b0 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     hi.vect._0_8_ + (lVar13 - local_360) * local_378 * 4 +
                                    (lVar20 - local_368) * 4)) {
                      iVar19 = local_1d4 - local_408.begin.y;
                      dVar27 = 0.0;
                      for (lVar23 = 1; lVar23 < lVar18; lVar23 = lVar23 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar20 - local_408.begin.x) +
                                           (lVar13 - local_408.begin.z) * local_408.kstride +
                                           local_408.nstride * uVar22 + local_408.jstride * iVar19]
                                          * local_2f8[lVar23];
                        iVar19 = iVar19 + -1;
                      }
                      local_408.p
                      [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)]
                           = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)
                        ] = local_1d0.p
                            [(local_2b0 - local_1d0.begin.y) * local_1d0.jstride +
                             (lVar13 - local_1d0.begin.z) * local_1d0.kstride +
                             local_1d0.nstride * uVar22 + (lVar20 - local_1d0.begin.x)] *
                            local_2f8[0] + dVar27;
                      }
                    }
                  }
                }
              }
              else {
                lVar20 = local_268;
                if (iVar19 == 0x66) {
                  for (; (int)lVar20 <= local_3b8; lVar20 = lVar20 + 1) {
                    lVar17 = (lVar20 - local_408.begin.z) * local_408.kstride;
                    for (lVar13 = 0; local_3a8 + lVar13 <= local_270; lVar13 = lVar13 + 1) {
                      if (0 < *(int *)((long)(local_394 - local_364) *
                                       CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                       (lVar20 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                       hi.vect._0_8_ + local_298 + lVar13 * 4)) {
                        *(undefined8 *)
                         ((long)local_408.p +
                         lVar13 * 8 +
                         local_408.jstride * 8 * (long)(local_394 - local_408.begin.y) + lVar17 * 8
                         + local_408.nstride * local_3c0 + (long)local_408.begin.x * -8 + local_2a0)
                             = *(undefined8 *)
                                ((long)local_408.p +
                                lVar13 * 8 +
                                (long)(~local_408.begin.y + local_394) * local_408.jstride * 8 +
                                lVar17 * 8 + local_408.nstride * local_3c0 +
                                (long)local_408.begin.x * -8 + local_2a0);
                      }
                    }
                  }
                }
                else if (iVar19 == 0x67) {
                  for (; (int)lVar20 <= local_3b8; lVar20 = lVar20 + 1) {
                    lVar17 = (lVar20 - local_408.begin.z) * local_408.kstride;
                    for (lVar13 = 0; local_3a8 + lVar13 <= local_270; lVar13 = lVar13 + 1) {
                      if (0 < *(int *)((long)(local_394 - local_364) *
                                       CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                       (lVar20 - local_360) * local_378 * 4 + (long)local_368 * -4 +
                                       hi.vect._0_8_ + local_298 + lVar13 * 4)) {
                        *(ulong *)((long)local_408.p +
                                  lVar13 * 8 +
                                  local_408.jstride * 8 * (long)(local_394 - local_408.begin.y) +
                                  lVar17 * 8 + local_408.nstride * local_3c0 +
                                  (long)local_408.begin.x * -8 + local_2a0) =
                             *(ulong *)((long)local_408.p +
                                       lVar13 * 8 +
                                       (long)(~local_408.begin.y + local_394) *
                                       local_408.jstride * 8 + lVar17 * 8 +
                                       local_408.nstride * local_3c0 + (long)local_408.begin.x * -8
                                       + local_2a0) ^ 0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
            else if ((int)local_178 == 0) {
              if (iVar11 == 0x65) {
                local_2f8[4] = -dVar27 * dVar6;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar14 = 0; iVar11 = local_3b0, uVar14 != uVar4; uVar14 = uVar14 + 1) {
                  dVar27 = dVar1;
                  dVar29 = dVar2;
                  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar14 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar29 = dVar29 * (local_2f8[uVar14 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar14] = dVar27 / dVar29;
                }
                for (; iVar11 <= local_3b4; iVar11 = iVar11 + 1) {
                  local_1e0 = iVar11;
                  lVar17 = (long)iVar11;
                  lVar24 = (lVar17 - local_408.begin.z) * local_408.kstride;
                  local_1f0 = (long)local_238.begin.y;
                  for (lVar13 = local_2a8; lVar13 <= lVar12; lVar13 = lVar13 + 1) {
                    if (0 < *(int *)((lVar20 - local_328) * 4 + low.vect._0_8_ +
                                     (lVar17 - local_320) * local_338 * 4 +
                                    (lVar13 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4)) {
                      dVar27 = 0.0;
                      for (lVar23 = 1; lVar23 < lVar18; lVar23 = lVar23 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar13 - local_408.begin.y) * local_408.jstride +
                                           (lVar17 - local_408.begin.z) * local_408.kstride +
                                           local_408.nstride * uVar22 +
                                           (long)((int)lVar23 + ((int)local_280 - local_408.begin.x)
                                                 )] * local_2f8[lVar23];
                      }
                      lVar23 = (lVar13 - local_408.begin.y) * local_408.jstride;
                      local_408.p
                      [(lVar20 - local_408.begin.x) + lVar24 + local_408.nstride * uVar22 + lVar23]
                           = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [(lVar20 - local_408.begin.x) + lVar24 + local_408.nstride * uVar22 + lVar23
                        ] = local_238.p
                            [(lVar20 - local_238.begin.x) +
                             (lVar17 - local_238.begin.z) * local_238.kstride +
                             local_238.nstride * uVar22 +
                             (lVar13 - local_238.begin.y) *
                             CONCAT44(local_238.jstride._4_4_,(int)local_238.jstride)] *
                            local_2f8[0] + dVar27;
                      }
                    }
                  }
                  lVar20 = local_280;
                }
              }
              else {
                lVar20 = local_260;
                if (iVar11 == 0x66) {
                  for (; (int)lVar20 <= local_3b4; lVar20 = lVar20 + 1) {
                    piVar21 = (int *)((local_2a8 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4
                                      + (lVar20 - local_320) * local_338 * 4 + (long)local_328 * -4
                                     + low.vect._0_8_ + local_288);
                    lVar17 = local_408.nstride * local_3c0 +
                             (local_2a8 - local_408.begin.y) * local_408.jstride * 8 +
                             (lVar20 - local_408.begin.z) * local_408.kstride * 8 +
                             (long)local_408.p;
                    for (lVar13 = local_2a8; lVar13 <= lVar12; lVar13 = lVar13 + 1) {
                      if (0 < *piVar21) {
                        *(undefined8 *)(lVar17 + local_290 + (long)local_408.begin.x * -8) =
                             *(undefined8 *)(lVar17 + (long)(local_250 - local_408.begin.x) * 8);
                      }
                      piVar21 = piVar21 + CONCAT44(uStack_33c,low.vect[2]);
                      lVar17 = lVar17 + local_408.jstride * 8;
                    }
                  }
                }
                else if (iVar11 == 0x67) {
                  for (; (int)lVar20 <= local_3b4; lVar20 = lVar20 + 1) {
                    piVar21 = (int *)((local_2a8 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4
                                      + (lVar20 - local_320) * local_338 * 4 + (long)local_328 * -4
                                     + low.vect._0_8_ + local_288);
                    lVar17 = local_408.nstride * local_3c0 +
                             (local_2a8 - local_408.begin.y) * local_408.jstride * 8 +
                             (lVar20 - local_408.begin.z) * local_408.kstride * 8 +
                             (long)local_408.p;
                    for (lVar13 = local_2a8; lVar13 <= lVar12; lVar13 = lVar13 + 1) {
                      if (0 < *piVar21) {
                        *(ulong *)(lVar17 + local_290 + (long)local_408.begin.x * -8) =
                             *(ulong *)(lVar17 + (long)(local_250 - local_408.begin.x) * 8) ^
                             0x8000000000000000;
                      }
                      piVar21 = piVar21 + CONCAT44(uStack_33c,low.vect[2]);
                      lVar17 = lVar17 + local_408.jstride * 8;
                    }
                  }
                }
              }
              uVar4 = local_240;
              uVar14 = local_2b8;
              if (iVar19 == 0x65) {
                local_2f8[4] = -dVar28 * dVar6;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar15 = 0; iVar11 = local_39c, uVar15 != uVar14; uVar15 = uVar15 + 1) {
                  dVar27 = dVar1;
                  dVar28 = dVar2;
                  for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar15 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar28 = dVar28 * (local_2f8[uVar15 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar15] = dVar27 / dVar28;
                }
                for (; local_3a0 = iVar19, iVar11 <= local_3b8; iVar11 = iVar11 + 1) {
                  local_1f0 = CONCAT44(local_1f0._4_4_,iVar11);
                  lVar13 = (long)iVar11;
                  lVar17 = (lVar13 - local_408.begin.z) * local_408.kstride;
                  for (lVar20 = local_2b0; lVar20 <= local_390; lVar20 = lVar20 + 1) {
                    if (0 < *(int *)((local_3a8 - local_368) * 4 + hi.vect._0_8_ +
                                     (lVar13 - local_360) * local_378 * 4 +
                                    (lVar20 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4)) {
                      iVar25 = local_1d8 - local_408.begin.x;
                      dVar27 = 0.0;
                      for (lVar24 = 1; lVar24 < lVar18; lVar24 = lVar24 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar20 - local_408.begin.y) * local_408.jstride +
                                           (lVar13 - local_408.begin.z) * local_408.kstride +
                                           local_408.nstride * uVar22 + (long)iVar25] *
                                          local_2f8[lVar24];
                        iVar25 = iVar25 + -1;
                      }
                      lVar24 = (lVar20 - local_408.begin.y) * local_408.jstride;
                      local_408.p
                      [(local_3a8 - local_408.begin.x) +
                       lVar17 + local_408.nstride * uVar22 + lVar24] = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [(local_3a8 - local_408.begin.x) +
                         lVar17 + local_408.nstride * uVar22 + lVar24] =
                             local_1d0.p
                             [(local_3a8 - local_1d0.begin.x) +
                              (lVar13 - local_1d0.begin.z) * local_1d0.kstride +
                              local_1d0.nstride * uVar22 +
                              (lVar20 - local_1d0.begin.y) * local_1d0.jstride] * local_2f8[0] +
                             dVar27;
                      }
                    }
                  }
                }
              }
              else {
                lVar20 = local_268;
                if (iVar19 == 0x66) {
                  for (; local_3a0 = iVar19, (int)lVar20 <= local_3b8; lVar20 = lVar20 + 1) {
                    piVar21 = (int *)((local_2b0 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4
                                      + (lVar20 - local_360) * local_378 * 4 + (long)local_368 * -4
                                     + hi.vect._0_8_ + local_298);
                    lVar17 = local_408.nstride * local_3c0 +
                             (local_2b0 - local_408.begin.y) * local_408.jstride * 8 +
                             (lVar20 - local_408.begin.z) * local_408.kstride * 8 +
                             (long)local_408.p;
                    for (lVar13 = local_2b0; lVar13 <= local_390; lVar13 = lVar13 + 1) {
                      if (0 < *piVar21) {
                        *(undefined8 *)(lVar17 + local_2a0 + (long)local_408.begin.x * -8) =
                             *(undefined8 *)(lVar17 + (long)(~local_408.begin.x + iVar10) * 8);
                      }
                      piVar21 = piVar21 + CONCAT44(uStack_37c,hi.vect[2]);
                      lVar17 = lVar17 + local_408.jstride * 8;
                    }
                  }
                }
                else {
                  local_3a0 = iVar19;
                  if (iVar19 == 0x67) {
                    for (; (int)lVar20 <= local_3b8; lVar20 = lVar20 + 1) {
                      piVar21 = (int *)((local_2b0 - local_364) *
                                        CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                        (lVar20 - local_360) * local_378 * 4 + (long)local_368 * -4
                                       + hi.vect._0_8_ + local_298);
                      lVar17 = local_408.nstride * local_3c0 +
                               (local_2b0 - local_408.begin.y) * local_408.jstride * 8 +
                               (lVar20 - local_408.begin.z) * local_408.kstride * 8 +
                               (long)local_408.p;
                      for (lVar13 = local_2b0; lVar13 <= local_390; lVar13 = lVar13 + 1) {
                        if (0 < *piVar21) {
                          *(ulong *)(lVar17 + local_2a0 + (long)local_408.begin.x * -8) =
                               *(ulong *)(lVar17 + (long)(~local_408.begin.x + iVar10) * 8) ^
                               0x8000000000000000;
                        }
                        piVar21 = piVar21 + CONCAT44(uStack_37c,hi.vect[2]);
                        lVar17 = lVar17 + local_408.jstride * 8;
                      }
                    }
                  }
                }
              }
            }
            else {
              if (iVar11 == 0x65) {
                local_2f8[4] = -dVar27 * dVar5;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar14 = 0; iVar11 = local_398, uVar14 != uVar4; uVar14 = uVar14 + 1) {
                  dVar27 = dVar1;
                  dVar29 = dVar2;
                  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar14 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar29 = dVar29 * (local_2f8[uVar14 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar14] = dVar27 / dVar29;
                }
                for (; local_3a0 = iVar19, iVar11 <= iVar3; iVar11 = iVar11 + 1) {
                  lVar13 = (long)iVar11;
                  lVar17 = (lVar13 - local_408.begin.y) * local_408.jstride;
                  lVar24 = (local_260 - local_408.begin.z) * local_408.kstride;
                  for (lVar20 = local_280; lVar20 <= local_278; lVar20 = lVar20 + 1) {
                    if (0 < *(int *)((lVar13 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                     low.vect._0_8_ + (local_260 - local_320) * local_338 * 4 +
                                    (lVar20 - local_328) * 4)) {
                      dVar27 = 0.0;
                      for (lVar23 = 1; lVar23 < lVar18; lVar23 = lVar23 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar13 - local_408.begin.y) * local_408.jstride +
                                           (lVar20 - local_408.begin.x) +
                                           local_408.nstride * uVar22 +
                                           ((local_3b0 - local_408.begin.z) + (int)lVar23) *
                                           local_408.kstride] * local_2f8[lVar23];
                      }
                      local_408.p
                      [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)]
                           = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)
                        ] = local_238.p
                            [(lVar13 - local_238.begin.y) *
                             CONCAT44(local_238.jstride._4_4_,(int)local_238.jstride) +
                             (local_260 - local_238.begin.z) * local_238.kstride +
                             local_238.nstride * uVar22 + (lVar20 - local_238.begin.x)] *
                            local_2f8[0] + dVar27;
                      }
                    }
                  }
                }
              }
              else {
                lVar20 = local_2a8;
                if (iVar11 == 0x66) {
                  for (; (int)lVar20 <= iVar3; lVar20 = lVar20 + 1) {
                    lVar13 = (lVar20 - local_408.begin.y) * local_408.jstride;
                    for (lVar17 = 0; local_280 + lVar17 <= local_278; lVar17 = lVar17 + 1) {
                      if (0 < *(int *)((local_3b0 - local_320) * local_338 * 4 +
                                       (lVar20 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                       (long)local_328 * -4 + low.vect._0_8_ + local_288 +
                                      lVar17 * 4)) {
                        *(undefined8 *)
                         ((long)local_408.p +
                         lVar17 * 8 +
                         (long)(local_3b0 - local_408.begin.z) * local_408.kstride * 8 + lVar13 * 8
                         + local_408.nstride * local_3c0 + (long)local_408.begin.x * -8 + local_290)
                             = *(undefined8 *)
                                ((long)local_408.p +
                                lVar17 * 8 +
                                local_408.kstride * 8 * (long)(local_254 - local_408.begin.z) +
                                lVar13 * 8 + local_408.nstride * local_3c0 +
                                (long)local_408.begin.x * -8 + local_290);
                      }
                    }
                  }
                }
                else if (iVar11 == 0x67) {
                  for (; (int)lVar20 <= iVar3; lVar20 = lVar20 + 1) {
                    lVar13 = (lVar20 - local_408.begin.y) * local_408.jstride;
                    for (lVar17 = 0; local_280 + lVar17 <= local_278; lVar17 = lVar17 + 1) {
                      if (0 < *(int *)((local_3b0 - local_320) * local_338 * 4 +
                                       (lVar20 - local_324) * CONCAT44(uStack_33c,low.vect[2]) * 4 +
                                       (long)local_328 * -4 + low.vect._0_8_ + local_288 +
                                      lVar17 * 4)) {
                        *(ulong *)((long)local_408.p +
                                  lVar17 * 8 +
                                  (long)(local_3b0 - local_408.begin.z) * local_408.kstride * 8 +
                                  lVar13 * 8 + local_408.nstride * local_3c0 +
                                  (long)local_408.begin.x * -8 + local_290) =
                             *(ulong *)((long)local_408.p +
                                       lVar17 * 8 +
                                       local_408.kstride * 8 * (long)(local_254 - local_408.begin.z)
                                       + lVar13 * 8 + local_408.nstride * local_3c0 +
                                       (long)local_408.begin.x * -8 + local_290) ^
                             0x8000000000000000;
                      }
                    }
                  }
                }
              }
              uVar4 = local_240;
              uVar14 = local_2b8;
              iVar11 = (int)local_390;
              if (iVar19 == 0x65) {
                local_2f8[4] = -dVar28 * dVar5;
                local_2f8[5] = 0.5;
                local_2f8[6] = 1.5;
                local_2f8[7] = 2.5;
                local_2f8[2] = 0.0;
                local_2f8[3] = 0.0;
                local_2f8[0] = 0.0;
                local_2f8[1] = 0.0;
                for (uVar15 = 0; iVar19 = local_394, uVar15 != uVar14; uVar15 = uVar15 + 1) {
                  dVar27 = dVar1;
                  dVar28 = dVar2;
                  for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                    if (uVar15 != uVar16) {
                      dVar27 = dVar27 * (-0.5 - local_2f8[uVar16 + 4]);
                      dVar28 = dVar28 * (local_2f8[uVar15 + 4] - local_2f8[uVar16 + 4]);
                    }
                  }
                  local_2f8[uVar15] = dVar27 / dVar28;
                }
                for (; iVar19 <= iVar11; iVar19 = iVar19 + 1) {
                  lVar13 = (long)iVar19;
                  lVar17 = (lVar13 - local_408.begin.y) * local_408.jstride;
                  lVar24 = (local_268 - local_408.begin.z) * local_408.kstride;
                  for (lVar20 = local_3a8; lVar20 <= local_270; lVar20 = lVar20 + 1) {
                    if (0 < *(int *)((lVar13 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                     hi.vect._0_8_ + (local_268 - local_360) * local_378 * 4 +
                                    (lVar20 - local_368) * 4)) {
                      iVar25 = local_1dc - local_408.begin.z;
                      dVar27 = 0.0;
                      for (lVar23 = 1; lVar23 < lVar18; lVar23 = lVar23 + 1) {
                        dVar27 = dVar27 + local_408.p
                                          [(lVar13 - local_408.begin.y) * local_408.jstride +
                                           (lVar20 - local_408.begin.x) +
                                           local_408.nstride * uVar22 + local_408.kstride * iVar25]
                                          * local_2f8[lVar23];
                        iVar25 = iVar25 + -1;
                      }
                      local_408.p
                      [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)]
                           = dVar27;
                      if (local_3ac == Inhomogeneous) {
                        local_408.p
                        [lVar17 + lVar24 + local_408.nstride * uVar22 + (lVar20 - local_408.begin.x)
                        ] = local_1d0.p
                            [(lVar13 - local_1d0.begin.y) * local_1d0.jstride +
                             (local_268 - local_1d0.begin.z) * local_1d0.kstride +
                             local_1d0.nstride * uVar22 + (lVar20 - local_1d0.begin.x)] *
                            local_2f8[0] + dVar27;
                      }
                    }
                  }
                }
              }
              else {
                lVar20 = local_2b0;
                if (iVar19 == 0x66) {
                  for (; (int)lVar20 <= iVar11; lVar20 = lVar20 + 1) {
                    lVar17 = (lVar20 - local_408.begin.y) * local_408.jstride;
                    for (lVar13 = 0; local_3a8 + lVar13 <= local_270; lVar13 = lVar13 + 1) {
                      if (0 < *(int *)((local_39c - local_360) * local_378 * 4 +
                                       (lVar20 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                       (long)local_368 * -4 + hi.vect._0_8_ + local_298 + lVar13 * 4
                                      )) {
                        *(undefined8 *)
                         ((long)local_408.p +
                         lVar13 * 8 +
                         (long)(local_39c - local_408.begin.z) * local_408.kstride * 8 + lVar17 * 8
                         + local_408.nstride * local_3c0 + (long)local_408.begin.x * -8 + local_2a0)
                             = *(undefined8 *)
                                ((long)local_408.p +
                                lVar13 * 8 +
                                local_408.kstride * 8 * (long)(~local_408.begin.z + local_39c) +
                                lVar17 * 8 + local_408.nstride * local_3c0 +
                                (long)local_408.begin.x * -8 + local_2a0);
                      }
                    }
                  }
                }
                else if (iVar19 == 0x67) {
                  for (; (int)lVar20 <= iVar11; lVar20 = lVar20 + 1) {
                    lVar17 = (lVar20 - local_408.begin.y) * local_408.jstride;
                    for (lVar13 = 0; local_3a8 + lVar13 <= local_270; lVar13 = lVar13 + 1) {
                      if (0 < *(int *)((local_39c - local_360) * local_378 * 4 +
                                       (lVar20 - local_364) * CONCAT44(uStack_37c,hi.vect[2]) * 4 +
                                       (long)local_368 * -4 + hi.vect._0_8_ + local_298 + lVar13 * 4
                                      )) {
                        *(ulong *)((long)local_408.p +
                                  lVar13 * 8 +
                                  (long)(local_39c - local_408.begin.z) * local_408.kstride * 8 +
                                  lVar17 * 8 + local_408.nstride * local_3c0 +
                                  (long)local_408.begin.x * -8 + local_2a0) =
                             *(ulong *)((long)local_408.p +
                                       lVar13 * 8 +
                                       local_408.kstride * 8 *
                                       (long)(~local_408.begin.z + local_39c) + lVar17 * 8 +
                                       local_408.nstride * local_3c0 + (long)local_408.begin.x * -8
                                       + local_2a0) ^ 0x8000000000000000;
                      }
                    }
                  }
                }
              }
            }
            local_3c0 = local_3c0 + 8;
            this_00 = local_248;
            local_3c8 = uVar22;
            uVar14 = uVar22 + 1;
          }
        }
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    Abort_host("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
  }
  BaseFab<double>::~BaseFab(&foofab.super_BaseFab<double>);
  return;
}

Assistant:

void
MLCellLinOp::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLCellLinOp::applyBC()");
    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    const int cross = isCrossStencil();
    const int tensorop = isTensorOp();
    if (!skip_fillboundary) {
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int flagbc = bc_mode == BCMode::Inhomogeneous;
    const int imaxorder = maxorder;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const Real dxi = dxinv[0];
    const Real dyi = (AMREX_SPACEDIM >= 2) ? dxinv[1] : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? dxinv[2] : Real(1.0);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.const_array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(cross || tensorop || Gpu::notInLaunchRegion(),
                                     "non-cross stencil not support for gpu");

    const int hidden_direction = hiddenDirection();

#ifdef AMREX_USE_GPU
    if ((cross || tensorop) && Gpu::inLaunchRegion())
    {
        Vector<ABCTag> tags;
        tags.reserve(in.local_size()*AMREX_SPACEDIM*ncomp);

        for (MFIter mfi(in); mfi.isValid(); ++mfi) {
            const Box& vbx = mfi.validbox();
            const auto& iofab = in.array(mfi);
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (idim != hidden_direction) {
                    const Orientation olo(idim,Orientation::low);
                    const Orientation ohi(idim,Orientation::high);
                    const auto& bvlo = (bndry != nullptr) ?
                        bndry->bndryValues(olo).const_array(mfi) : foo;
                    const auto& bvhi = (bndry != nullptr) ?
                        bndry->bndryValues(ohi).const_array(mfi) : foo;
                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        tags.emplace_back(ABCTag{iofab, bvlo, bvhi,
                                                 maskvals[olo].const_array(mfi),
                                                 maskvals[ohi].const_array(mfi),
                                                 bdlv[icomp][olo], bdlv[icomp][ohi],
                                                 amrex::adjCell(vbx,olo),
                                                 bdcv[icomp][olo], bdcv[icomp][ohi],
                                                 vbx.length(idim), icomp, idim});
                    }
                }
            }
        }

        ParallelFor(tags,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, ABCTag const& tag) noexcept
        {
            if (tag.dir == 0)
            {
                mllinop_apply_bc_x(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dxi, flagbc, tag.comp);
                mllinop_apply_bc_x(1, i+tag.blen+1, j, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dxi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 1)
            else
#if (AMREX_SPACEDIM > 2)
            if (tag.dir == 1)
#endif
            {
                mllinop_apply_bc_y(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dyi, flagbc, tag.comp);
                mllinop_apply_bc_y(1, i, j+tag.blen+1, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dyi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 2)
            else {
                mllinop_apply_bc_z(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dzi, flagbc, tag.comp);
                mllinop_apply_bc_z(1, i, j, k+tag.blen+1, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dzi, flagbc, tag.comp);
            }
#endif
#endif
        });
    } else
#endif
    if (cross || tensorop)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();
            const auto& iofab = in.array(mfi);

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (hidden_direction == idim) continue;
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                const Box blo = amrex::adjCellLo(vbx, idim);
                const Box bhi = amrex::adjCellHi(vbx, idim);
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).const_array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).const_array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (idim == 0) {
                        mllinop_apply_bc_x(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dxi, flagbc, icomp);
                        mllinop_apply_bc_x(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dxi, flagbc, icomp);
                    } else if (idim == 1) {
                        mllinop_apply_bc_y(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dyi, flagbc, icomp);
                        mllinop_apply_bc_y(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dyi, flagbc, icomp);
                    } else {
                        mllinop_apply_bc_z(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dzi, flagbc, icomp);
                        mllinop_apply_bc_z(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dzi, flagbc, icomp);
                    }
                }
            }
        }
    }
    else
    {
#ifdef BL_NO_FORT
        amrex::Abort("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
#else
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            const RealTuple & bdl = bdlv[0];
            const BCTuple   & bdc = bdcv[0];

            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation ori = oitr();

                int  cdr = ori;
                Real bcl = bdl[ori];
                int  bct = bdc[ori];

                const FArrayBox& fsfab = (bndry != nullptr) ? bndry->bndryValues(ori)[mfi] : foofab;

                const Mask& m = maskvals[ori][mfi];

                amrex_mllinop_apply_bc(BL_TO_FORTRAN_BOX(vbx),
                                       BL_TO_FORTRAN_ANYD(in[mfi]),
                                       BL_TO_FORTRAN_ANYD(m),
                                       cdr, bct, bcl,
                                       BL_TO_FORTRAN_ANYD(fsfab),
                                       maxorder, dxinv, flagbc, ncomp, cross);
            }
        }
#endif
    }
}